

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O3

void __thiscall
backend::codegen::RegAllocator::replace_read
          (RegAllocator *this,Reg *r,int i,optional<unsigned_int> pre_alloc_transient)

{
  ConditionCode CVar1;
  uint uVar2;
  int iVar3;
  pointer puVar4;
  Inst *pIVar5;
  pointer puVar6;
  short sVar7;
  ulong uVar8;
  bool bVar9;
  Reg RVar10;
  pointer __p;
  iterator iVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  iterator iVar13;
  ostream *poVar14;
  char *pcVar15;
  Interval IVar16;
  MemoryOperand *other;
  Tag *pTVar17;
  MemoryOperand *this_00;
  _Storage<unsigned_int,_true> _Var18;
  pointer *__ptr;
  size_type __dnew;
  anon_class_8_2_9473111c disp_reg;
  ostream local_129;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  undefined8 local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  Displayable local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  ulong local_e8;
  _Head_base<0UL,_arm::LoadStoreInst_*,_false> local_e0;
  undefined1 *local_d8;
  undefined8 local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  undefined1 local_b8;
  int local_ac;
  undefined1 local_a8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Alloc_hider local_80;
  ulong local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  size_t local_60;
  bool local_58;
  anon_class_8_2_9473111c local_50;
  undefined **local_48;
  undefined8 local_40;
  undefined1 local_38;
  
  local_50.r = *r;
  pTVar17 = (Tag *)(ulong)local_50.r;
  local_50.i = i;
  RVar10 = get_collapse_reg(this,local_50.r);
  *r = RVar10;
  if (RVar10 < 0x40) {
    replace_read::anon_class_8_2_9473111c::operator()(&local_50);
    local_129 = (ostream)0x0;
    AixLog::operator<<(&local_129,(Severity *)pTVar17);
    local_d8 = &local_c8;
    local_e0._M_head_impl = (LoadStoreInst *)&PTR__Tag_001eaf88;
    local_d0 = 0;
    local_c8 = 0;
    local_b8 = 1;
    AixLog::operator<<((ostream *)&local_e0,pTVar17);
    local_40 = std::chrono::_V2::system_clock::now();
    local_48 = &PTR__Timestamp_001eaf58;
    local_38 = 0;
    AixLog::operator<<((ostream *)&local_48,(Timestamp *)pTVar17);
    local_f8._M_allocated_capacity = 0x5f6563616c706572;
    local_f8._8_4_ = 0x64616572;
    local_100._vptr_Displayable = (_func_int **)0xc;
    local_f8._12_4_ = local_f8._12_4_ & 0xffffff00;
    local_e8 = 0x60;
    local_128 = &local_118;
    local_108 = &local_f8;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)std::__cxx11::string::_M_create((ulong *)&local_128,(ulong)&local_e8);
    uVar8 = local_e8;
    local_118._M_allocated_capacity = local_e8;
    pcVar15 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
    ;
    local_128 = paVar12;
    memcpy(paVar12,
           "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
           ,0x60);
    paVar12->_M_local_buf[uVar8] = '\0';
    local_a8._8_8_ = &local_90;
    local_a8._0_8_ = &PTR__Function_001eafb8;
    if (local_108 == &local_f8) {
      local_90._8_8_ = CONCAT44(local_f8._12_4_,local_f8._8_4_);
    }
    else {
      local_a8._8_8_ = local_108;
    }
    local_90._M_allocated_capacity = local_f8._M_allocated_capacity;
    local_80._M_p = (pointer)&local_70;
    local_a8._16_8_ = local_100._vptr_Displayable;
    local_100._vptr_Displayable = (_func_int **)0x0;
    local_f8._M_allocated_capacity = local_f8._M_allocated_capacity & 0xffffffffffffff00;
    if (local_128 == &local_118) {
      local_70._8_8_ = local_118._8_8_;
    }
    else {
      local_80._M_p = (pointer)local_128;
    }
    local_70._M_allocated_capacity = local_118._M_allocated_capacity;
    local_78 = uVar8;
    local_120 = 0;
    local_118._M_allocated_capacity = local_118._M_allocated_capacity & 0xffffffffffffff00;
    local_60 = 0x26f;
    local_58 = false;
    local_128 = &local_118;
    local_108 = &local_f8;
    AixLog::operator<<((ostream *)local_a8,(Function *)pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"phys",4);
    std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    AixLog::Function::~Function((Function *)local_a8);
    if (local_128 != &local_118) {
      operator_delete(local_128,local_118._M_allocated_capacity + 1);
    }
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8._M_allocated_capacity + 1);
    }
LAB_00174953:
    local_e0._M_head_impl = (LoadStoreInst *)&PTR__Tag_001eaf88;
    if (local_d8 == &local_c8) {
      return;
    }
    operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
    return;
  }
  pTVar17 = (Tag *)r;
  iVar11 = std::
           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&(this->reg_map)._M_h,r);
  if (iVar11.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur !=
      (__node_type *)0x0) {
    replace_read::anon_class_8_2_9473111c::operator()(&local_50);
    local_129 = (ostream)0x0;
    AixLog::operator<<(&local_129,(Severity *)pTVar17);
    local_d8 = &local_c8;
    local_e0._M_head_impl = (LoadStoreInst *)&PTR__Tag_001eaf88;
    local_d0 = 0;
    local_c8 = 0;
    local_b8 = 1;
    AixLog::operator<<((ostream *)&local_e0,pTVar17);
    local_40 = std::chrono::_V2::system_clock::now();
    local_48 = &PTR__Timestamp_001eaf58;
    local_38 = 0;
    AixLog::operator<<((ostream *)&local_48,(Timestamp *)pTVar17);
    local_f8._M_allocated_capacity = 0x5f6563616c706572;
    local_f8._8_4_ = 0x64616572;
    local_100._vptr_Displayable = (_func_int **)0xc;
    local_f8._12_4_ = local_f8._12_4_ & 0xffffff00;
    local_e8 = 0x60;
    local_128 = &local_118;
    local_108 = &local_f8;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)std::__cxx11::string::_M_create((ulong *)&local_128,(ulong)&local_e8);
    uVar8 = local_e8;
    local_118._M_allocated_capacity = local_e8;
    pcVar15 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
    ;
    local_128 = paVar12;
    memcpy(paVar12,
           "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
           ,0x60);
    paVar12->_M_local_buf[uVar8] = '\0';
    local_a8._8_8_ = &local_90;
    local_a8._0_8_ = &PTR__Function_001eafb8;
    if (local_108 == &local_f8) {
      local_90._8_8_ = CONCAT44(local_f8._12_4_,local_f8._8_4_);
    }
    else {
      local_a8._8_8_ = local_108;
    }
    local_90._M_allocated_capacity = local_f8._M_allocated_capacity;
    local_80._M_p = (pointer)&local_70;
    local_a8._16_8_ = local_100._vptr_Displayable;
    local_100._vptr_Displayable = (_func_int **)0x0;
    local_f8._M_allocated_capacity = local_f8._M_allocated_capacity & 0xffffffffffffff00;
    if (local_128 == &local_118) {
      local_70._8_8_ = local_118._8_8_;
    }
    else {
      local_80._M_p = (pointer)local_128;
    }
    local_70._M_allocated_capacity = local_118._M_allocated_capacity;
    local_78 = uVar8;
    local_120 = 0;
    local_118._M_allocated_capacity = local_118._M_allocated_capacity & 0xffffffffffffff00;
    local_60 = 0x274;
    local_58 = false;
    local_128 = &local_118;
    local_108 = &local_f8;
    AixLog::operator<<((ostream *)local_a8,(Function *)pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"graph ",6);
    poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    AixLog::Function::~Function((Function *)local_a8);
    if (local_128 != &local_118) {
      operator_delete(local_128,local_118._M_allocated_capacity + 1);
    }
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8._M_allocated_capacity + 1);
    }
    local_e0._M_head_impl = (LoadStoreInst *)&PTR__Tag_001eaf88;
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
    }
    *r = *(Reg *)((long)iVar11.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                        ._M_cur + 0xc);
    return;
  }
  iVar13 = std::
           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&(this->spilled_regs)._M_h,r);
  if (iVar13.
      super__Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false>.
      _M_cur == (__node_type *)0x0) {
    iVar13 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(this->live_intervals)._M_h,r);
    if (iVar13.
        super__Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false>.
        _M_cur == (__node_type *)0x0) {
      std::__throw_out_of_range("_Map_base::at");
    }
    IVar16 = *(Interval *)
              ((long)iVar13.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false>
                     ._M_cur + 0xc);
    RVar10 = alloc_transient_reg(this,IVar16,(optional<unsigned_int>)((ulong)*r | 0x100000000));
    *r = RVar10;
    replace_read::anon_class_8_2_9473111c::operator()(&local_50);
    local_129 = (ostream)0x0;
    AixLog::operator<<(&local_129,(Severity *)IVar16);
    local_e0._M_head_impl = (LoadStoreInst *)&PTR__Tag_001eaf88;
    local_d0 = 0;
    local_c8 = 0;
    local_b8 = 1;
    local_d8 = &local_c8;
    AixLog::operator<<((ostream *)&local_e0,(Tag *)IVar16);
    local_40 = std::chrono::_V2::system_clock::now();
    local_48 = &PTR__Timestamp_001eaf58;
    local_38 = 0;
    AixLog::operator<<((ostream *)&local_48,(Timestamp *)IVar16);
    local_f8._M_allocated_capacity = 0x5f6563616c706572;
    local_f8._8_4_ = 0x64616572;
    local_100._vptr_Displayable = (_func_int **)0xc;
    local_f8._12_4_ = local_f8._12_4_ & 0xffffff00;
    local_e8 = 0x60;
    local_128 = &local_118;
    local_108 = &local_f8;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)std::__cxx11::string::_M_create((ulong *)&local_128,(ulong)&local_e8);
    uVar8 = local_e8;
    local_118._M_allocated_capacity = local_e8;
    pcVar15 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
    ;
    local_128 = paVar12;
    memcpy(paVar12,
           "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
           ,0x60);
    paVar12->_M_local_buf[uVar8] = '\0';
    local_a8._0_8_ = &PTR__Function_001eafb8;
    if (local_108 == &local_f8) {
      local_90._8_8_ = CONCAT44(local_f8._12_4_,local_f8._8_4_);
      local_a8._8_8_ = &local_90;
    }
    else {
      local_a8._8_8_ = local_108;
    }
    local_90._M_allocated_capacity = local_f8._M_allocated_capacity;
    local_80._M_p = (pointer)&local_70;
    local_a8._16_8_ = local_100._vptr_Displayable;
    local_100._vptr_Displayable = (_func_int **)0x0;
    local_f8._M_allocated_capacity = local_f8._M_allocated_capacity & 0xffffffffffffff00;
    if (local_128 == &local_118) {
      local_70._8_8_ = local_118._8_8_;
    }
    else {
      local_80._M_p = (pointer)local_128;
    }
    local_70._M_allocated_capacity = local_118._M_allocated_capacity;
    local_78 = uVar8;
    local_120 = 0;
    local_118._M_allocated_capacity = local_118._M_allocated_capacity & 0xffffffffffffff00;
    local_60 = 0x2a3;
    local_58 = false;
    local_128 = &local_118;
    local_108 = &local_f8;
    AixLog::operator<<((ostream *)local_a8,(Function *)pcVar15);
    pcVar15 = "transient ";
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"transient ",10);
    AixLog::Function::~Function((Function *)local_a8);
    if (local_128 != &local_118) {
      pcVar15 = (char *)(local_118._M_allocated_capacity + 1);
      operator_delete(local_128,(ulong)pcVar15);
    }
    if (local_108 != &local_f8) {
      pcVar15 = (char *)(local_f8._M_allocated_capacity + 1);
      operator_delete(local_108,(ulong)pcVar15);
    }
    local_e0._M_head_impl = (LoadStoreInst *)&PTR__Tag_001eaf88;
    if (local_d8 != &local_c8) {
      pcVar15 = (char *)(CONCAT71(uStack_c7,local_c8) + 1);
      operator_delete(local_d8,(ulong)pcVar15);
    }
    local_129 = (ostream)0x0;
    AixLog::operator<<(&local_129,(Severity *)pcVar15);
    local_e0._M_head_impl = (LoadStoreInst *)&PTR__Tag_001eaf88;
    local_d0 = 0;
    local_c8 = 0;
    local_b8 = 1;
    local_d8 = &local_c8;
    AixLog::operator<<((ostream *)&local_e0,(Tag *)pcVar15);
    local_40 = std::chrono::_V2::system_clock::now();
    local_48 = &PTR__Timestamp_001eaf58;
    local_38 = 0;
    AixLog::operator<<((ostream *)&local_48,(Timestamp *)pcVar15);
    local_f8._M_allocated_capacity = 0x5f6563616c706572;
    local_f8._8_4_ = 0x64616572;
    local_100._vptr_Displayable = (_func_int **)0xc;
    local_f8._12_4_ = local_f8._12_4_ & 0xffffff00;
    local_e8 = 0x60;
    local_128 = &local_118;
    local_108 = &local_f8;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)std::__cxx11::string::_M_create((ulong *)&local_128,(ulong)&local_e8);
    uVar8 = local_e8;
    local_118._M_allocated_capacity = local_e8;
    pcVar15 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
    ;
    local_128 = paVar12;
    memcpy(paVar12,
           "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
           ,0x60);
    paVar12->_M_local_buf[uVar8] = '\0';
    local_a8._0_8_ = &PTR__Function_001eafb8;
    if (local_108 == &local_f8) {
      local_90._8_8_ = CONCAT44(local_f8._12_4_,local_f8._8_4_);
      local_a8._8_8_ = &local_90;
    }
    else {
      local_a8._8_8_ = local_108;
    }
    local_90._M_allocated_capacity = local_f8._M_allocated_capacity;
    local_80._M_p = (pointer)&local_70;
    local_a8._16_8_ = local_100._vptr_Displayable;
    local_100._vptr_Displayable = (_func_int **)0x0;
    local_f8._M_allocated_capacity = local_f8._M_allocated_capacity & 0xffffffffffffff00;
    if (local_128 == &local_118) {
      local_70._8_8_ = local_118._8_8_;
    }
    else {
      local_80._M_p = (pointer)local_128;
    }
    local_70._M_allocated_capacity = local_118._M_allocated_capacity;
    local_78 = uVar8;
    local_120 = 0;
    local_118._M_allocated_capacity = local_118._M_allocated_capacity & 0xffffffffffffff00;
    local_60 = 0x2a4;
    local_58 = false;
    local_128 = &local_118;
    local_108 = &local_f8;
    AixLog::operator<<((ostream *)local_a8,(Function *)pcVar15);
    pTVar17 = (Tag *)(ulong)*r;
    arm::display_reg_name((ostream *)&std::clog,*r);
    AixLog::Function::~Function((Function *)local_a8);
    if (local_128 != &local_118) {
      pTVar17 = (Tag *)(local_118._M_allocated_capacity + 1);
      operator_delete(local_128,(ulong)pTVar17);
    }
    if (local_108 != &local_f8) {
      pTVar17 = (Tag *)(local_f8._M_allocated_capacity + 1);
      operator_delete(local_108,(ulong)pTVar17);
    }
    local_e0._M_head_impl = (LoadStoreInst *)&PTR__Tag_001eaf88;
    if (local_d8 != &local_c8) {
      pTVar17 = (Tag *)(CONCAT71(uStack_c7,local_c8) + 1);
      operator_delete(local_d8,(ulong)pTVar17);
    }
    local_129 = (ostream)0x0;
    AixLog::operator<<(&local_129,(Severity *)pTVar17);
    local_e0._M_head_impl = (LoadStoreInst *)&PTR__Tag_001eaf88;
    local_d0 = 0;
    local_c8 = 0;
    local_b8 = 1;
    local_d8 = &local_c8;
    AixLog::operator<<((ostream *)&local_e0,pTVar17);
    local_40 = std::chrono::_V2::system_clock::now();
    local_48 = &PTR__Timestamp_001eaf58;
    local_38 = 0;
    AixLog::operator<<((ostream *)&local_48,(Timestamp *)pTVar17);
    local_f8._M_allocated_capacity = 0x5f6563616c706572;
    local_f8._8_4_ = 0x64616572;
    local_100._vptr_Displayable = (_func_int **)0xc;
    local_f8._12_4_ = local_f8._12_4_ & 0xffffff00;
    local_e8 = 0x60;
    local_128 = &local_118;
    local_108 = &local_f8;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)std::__cxx11::string::_M_create((ulong *)&local_128,(ulong)&local_e8);
    uVar8 = local_e8;
    local_118._M_allocated_capacity = local_e8;
    pcVar15 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
    ;
    local_128 = paVar12;
    memcpy(paVar12,
           "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
           ,0x60);
    paVar12->_M_local_buf[uVar8] = '\0';
    local_a8._0_8_ = &PTR__Function_001eafb8;
    if (local_108 == &local_f8) {
      local_90._8_8_ = CONCAT44(local_f8._12_4_,local_f8._8_4_);
      local_a8._8_8_ = &local_90;
    }
    else {
      local_a8._8_8_ = local_108;
    }
    local_90._M_allocated_capacity = local_f8._M_allocated_capacity;
    local_80._M_p = (pointer)&local_70;
    local_a8._16_8_ = local_100._vptr_Displayable;
    local_100._vptr_Displayable = (_func_int **)0x0;
    local_f8._M_allocated_capacity = local_f8._M_allocated_capacity & 0xffffffffffffff00;
    if (local_128 == &local_118) {
      local_70._8_8_ = local_118._8_8_;
    }
    else {
      local_80._M_p = (pointer)local_128;
    }
    local_70._M_allocated_capacity = local_118._M_allocated_capacity;
    local_78 = uVar8;
    local_120 = 0;
    local_118._M_allocated_capacity = local_118._M_allocated_capacity & 0xffffffffffffff00;
    local_60 = 0x2a5;
    local_58 = false;
    local_128 = &local_118;
    local_108 = &local_f8;
    AixLog::operator<<((ostream *)local_a8,(Function *)pcVar15);
    std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    AixLog::Function::~Function((Function *)local_a8);
    if (local_128 != &local_118) {
      operator_delete(local_128,local_118._M_allocated_capacity + 1);
    }
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8._M_allocated_capacity + 1);
    }
    goto LAB_00174953;
  }
  local_ac = get_or_alloc_spill_pos(this,*r);
  uVar2 = *(uint *)((long)iVar13.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false>
                          ._M_cur + 0x10);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&(this->spilled_regs)._M_h,r);
  if (((ulong)pre_alloc_transient.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
    IVar16.end = uVar2;
    IVar16.start = i;
    RVar10 = alloc_transient_reg(this,IVar16,(optional<unsigned_int>)((ulong)*r | 0x100000000));
    pre_alloc_transient.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int>._4_4_ = 0;
    pre_alloc_transient.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int>._M_payload._M_value = RVar10;
  }
  puVar4 = (this->inst_sink).
           super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  _Var18._M_value =
       pre_alloc_transient.super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>._M_payload;
  if ((puVar4 != (this->inst_sink).
                 super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) &&
     (pIVar5 = puVar4[-1]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
               _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
               super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl,
     (pIVar5->super_Displayable)._vptr_Displayable == (_func_int **)&PTR_display_001ed9b0)) {
    this_00 = (MemoryOperand *)0x0;
    if ((char)pIVar5[4].op == B) {
      this_00 = (MemoryOperand *)&pIVar5[1].op;
    }
    if ((pIVar5->op == StR) &&
       (*(uint *)&pIVar5[1].super_Displayable._vptr_Displayable == _Var18._M_value)) {
      other = (MemoryOperand *)local_a8;
      local_a8._0_8_ = &PTR_display_001ed7f0;
      local_a8._8_4_ = (uint)local_a8._8_8_ & 0xffffff00;
      local_a8._12_4_ = 0xd;
      local_a8._16_2_ = (short)this->stack_offset + (short)local_ac;
      local_90._M_local_buf[8] = 1;
      bVar9 = arm::MemoryOperand::operator==(this_00,other);
      if ((bVar9) &&
         ((puVar4[-1]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
           super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
           super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl)->cond == this->cur_cond)) {
        puVar6 = (this->inst_sink).
                 super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        puVar4 = puVar6 + -1;
        (this->inst_sink).
        super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar4;
        pIVar5 = puVar6[-1]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                 _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                 super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
        if (pIVar5 != (Inst *)0x0) {
          (*(pIVar5->super_Displayable)._vptr_Displayable[2])();
        }
        (puVar4->_M_t).super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
        super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
        super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = (Inst *)0x0;
        if ((this->delayed_store).
            super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
            super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_engaged == true)
        {
          (this->delayed_store).
          super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
          super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_payload._M_value.
          first = *r;
          (this->delayed_store).
          super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
          super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_payload._M_value.
          second = (uint)_Var18;
        }
        else {
          (this->delayed_store).
          super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
          super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_payload =
               (_Storage<std::pair<unsigned_int,_unsigned_int>,_true>)
               ((long)pre_alloc_transient.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int> << 0x20 | (ulong)*r);
          (this->delayed_store).
          super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
          super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_engaged = true;
        }
        goto LAB_00174b73;
      }
    }
  }
  iVar3 = this->stack_offset;
  sVar7 = (short)local_ac;
  local_a8._0_8_ = operator_new(0x50);
  CVar1 = this->cur_cond;
  *(undefined4 *)(local_a8._0_8_ + 8) = 0x1a;
  *(ConditionCode *)(local_a8._0_8_ + 0xc) = CVar1;
  *(undefined ***)local_a8._0_8_ = &PTR_display_001ed9b0;
  ((_Storage<unsigned_int,_true> *)(local_a8._0_8_ + 0x10))->_M_value = (uint)_Var18;
  *(undefined ***)(local_a8._0_8_ + 0x18) = &PTR_display_001ed7f0;
  *(_func_int **)(local_a8._0_8_ + 0x20) = (_func_int *)0xd00000000;
  *(undefined1 *)(local_a8._0_8_ + 0x38) = 1;
  *(short *)(local_a8._0_8_ + 0x28) = (short)iVar3 + sVar7;
  *(undefined1 *)(local_a8._0_8_ + 0x48) = 1;
  local_e0._M_head_impl = (LoadStoreInst *)0x0;
  other = (MemoryOperand *)local_a8;
  std::
  vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
  ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
            ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
              *)&this->inst_sink,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)other);
  if ((_func_int **)local_a8._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_a8._0_8_ + 0x10))();
  }
  local_a8._0_8_ = (_func_int **)0x0;
  std::unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_>::~unique_ptr
            ((unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_> *)&local_e0);
LAB_00174b73:
  replace_read::anon_class_8_2_9473111c::operator()(&local_50);
  local_129 = (ostream)0x0;
  AixLog::operator<<(&local_129,(Severity *)other);
  local_d8 = &local_c8;
  local_e0._M_head_impl = (LoadStoreInst *)&PTR__Tag_001eaf88;
  local_d0 = 0;
  local_c8 = 0;
  local_b8 = 1;
  AixLog::operator<<((ostream *)&local_e0,(Tag *)other);
  local_40 = std::chrono::_V2::system_clock::now();
  local_48 = &PTR__Timestamp_001eaf58;
  local_38 = 0;
  AixLog::operator<<((ostream *)&local_48,(Timestamp *)other);
  local_f8._M_allocated_capacity = 0x5f6563616c706572;
  local_f8._8_4_ = 0x64616572;
  local_100._vptr_Displayable = (_func_int **)0xc;
  local_f8._12_4_ = local_f8._12_4_ & 0xffffff00;
  local_e8 = 0x60;
  local_128 = &local_118;
  local_108 = &local_f8;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)std::__cxx11::string::_M_create((ulong *)&local_128,(ulong)&local_e8);
  uVar8 = local_e8;
  local_118._M_allocated_capacity = local_e8;
  pcVar15 = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
  ;
  local_128 = paVar12;
  memcpy(paVar12,
         "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
         ,0x60);
  paVar12->_M_local_buf[uVar8] = '\0';
  local_a8._8_8_ = &local_90;
  local_a8._0_8_ = &PTR__Function_001eafb8;
  if (local_108 == &local_f8) {
    local_90._8_8_ = CONCAT44(local_f8._12_4_,local_f8._8_4_);
  }
  else {
    local_a8._8_8_ = local_108;
  }
  local_90._M_allocated_capacity = local_f8._M_allocated_capacity;
  local_80._M_p = (pointer)&local_70;
  local_a8._16_8_ = local_100._vptr_Displayable;
  local_100._vptr_Displayable = (_func_int **)0x0;
  local_f8._M_allocated_capacity = local_f8._M_allocated_capacity & 0xffffffffffffff00;
  if (local_128 == &local_118) {
    local_70._8_8_ = local_118._8_8_;
  }
  else {
    local_80._M_p = (pointer)local_128;
  }
  local_70._M_allocated_capacity = local_118._M_allocated_capacity;
  local_78 = uVar8;
  local_120 = 0;
  local_118._M_allocated_capacity = local_118._M_allocated_capacity & 0xffffffffffffff00;
  local_60 = 0x29b;
  local_58 = false;
  local_128 = &local_118;
  local_108 = &local_f8;
  AixLog::operator<<((ostream *)local_a8,(Function *)pcVar15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"spill ",6);
  poVar14 = (ostream *)std::ostream::operator<<(&std::clog,local_ac);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"with rd=",8);
  poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
  std::ostream::put((char)poVar14);
  std::ostream::flush();
  AixLog::Function::~Function((Function *)local_a8);
  if (local_128 != &local_118) {
    operator_delete(local_128,local_118._M_allocated_capacity + 1);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108,local_f8._M_allocated_capacity + 1);
  }
  local_e0._M_head_impl = (LoadStoreInst *)&PTR__Tag_001eaf88;
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
  }
  *r = (Reg)_Var18;
  return;
}

Assistant:

void RegAllocator::replace_read(Reg &r, int i,
                                std::optional<Reg> pre_alloc_transient) {
  auto disp_reg = [r, i]() {
    display_reg_name(LOG(TRACE), r);
    LOG(TRACE) << " at: " << i << " ";
  };
  r = get_collapse_reg(r);
  if (!is_virtual_register(r)) {
    disp_reg();
    LOG(TRACE) << "phys" << std::endl;
    return;
  } else if (auto reg_map_r = reg_map.find(r); reg_map_r != reg_map.end()) {
    // This register is allocated with graph-coloring
    disp_reg();
    LOG(TRACE) << "graph " << reg_map_r->second << std::endl;
    r = reg_map_r->second;
    return;
  } else if (auto spill_r = spilled_regs.find(r);
             spill_r != spilled_regs.end()) {
    // this register is allocated in stack
    bool del = false;

    Reg rd;
    auto spill_pos = get_or_alloc_spill_pos(r);
    auto interval = spill_r->second;
    interval.start = i;
    spilled_regs.erase(r);
    if (pre_alloc_transient) {
      rd = pre_alloc_transient.value();
    } else {
      rd = alloc_transient_reg(interval, r);
    }

    if (inst_sink.size() > 0) {
      auto &x = inst_sink.back();
      if (auto x_ = dynamic_cast<LoadStoreInst *>(&*x)) {
        if (auto x__ = std::get_if<MemoryOperand>(&x_->mem);
            x_->op == arm::OpCode::StR && x_->rd == rd &&
            (*x__) == MemoryOperand(REG_SP, spill_pos + stack_offset) &&
            x->cond == cur_cond) {
          del = true;
        }
      }
    }
    if (del) {
      inst_sink.pop_back();
      delayed_store = {{r, rd}};
    } else {
      inst_sink.push_back(std::make_unique<LoadStoreInst>(
          OpCode::LdR, rd, MemoryOperand(REG_SP, spill_pos + stack_offset),
          cur_cond));
    }
    disp_reg();
    LOG(TRACE) << "spill " << spill_pos << "with rd=" << rd << std::endl;
    r = rd;
    return;
  } else {
    // is temporary register
    auto live_interval = live_intervals.at(r);
    r = alloc_transient_reg(live_interval, r);
    disp_reg();
    LOG(TRACE) << "transient ";
    display_reg_name(LOG(TRACE), r);
    LOG(TRACE) << std::endl;
    return;
  }
}